

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O2

void __thiscall
QUrlModel::dataChanged(QUrlModel *this,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  undefined8 *puVar1;
  WatchItem *pWVar2;
  long lVar3;
  int i;
  ulong uVar4;
  long in_FS_OFFSET;
  QModelIndex local_90;
  QModelIndex local_78;
  undefined8 local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::parent((QModelIndex *)&local_58,topLeft);
  lVar3 = 0x18;
  for (uVar4 = 0; uVar4 < (ulong)(this->watching).d.size; uVar4 = uVar4 + 1) {
    pWVar2 = (this->watching).d.ptr;
    puVar1 = (undefined8 *)((long)pWVar2 + lVar3 + -0x18);
    local_78._0_8_ = *puVar1;
    local_78.i = puVar1[1];
    local_78.m.ptr = *(QAbstractItemModel **)((long)pWVar2 + lVar3 + -8);
    if ((((topLeft->r <= local_78.r) && (local_78.r <= bottomRight->r)) &&
        (topLeft->c <= local_78.c)) && (local_78.c <= bottomRight->c)) {
      QModelIndex::parent(&local_90,&local_78);
      if (((local_90.r == (int)local_58) && (local_90.c == local_58._4_4_)) &&
         (((undefined1 *)local_90.i == puStack_50 && (local_90.m.ptr == local_48.ptr)))) {
        changed(this,(QString *)((long)&(((this->watching).d.ptr)->index).r + lVar3));
      }
    }
    lVar3 = lVar3 + 0x30;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUrlModel::dataChanged(const QModelIndex &topLeft, const QModelIndex &bottomRight)
{
    QModelIndex parent = topLeft.parent();
    for (int i = 0; i < watching.size(); ++i) {
        QModelIndex index = watching.at(i).index;
        if (index.model() && topLeft.model()) {
            Q_ASSERT(index.model() == topLeft.model());
        }
        if (   index.row() >= topLeft.row()
            && index.row() <= bottomRight.row()
            && index.column() >= topLeft.column()
            && index.column() <= bottomRight.column()
            && index.parent() == parent) {
                changed(watching.at(i).path);
        }
    }
}